

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cpp
# Opt level: O2

fdPtr __thiscall Liby::FileDescriptor::openFile(FileDescriptor *this,string *filepath)

{
  int iVar1;
  Logger *this_00;
  int *piVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  shared_ptr<Liby::FileDescriptor> sVar3;
  fdPtr fVar4;
  int fd;
  
  if (filepath->_M_string_length != 0) {
    iVar1 = open((filepath->_M_dataplus)._M_p,2);
    if (-1 < iVar1) {
      sVar3 = std::make_shared<Liby::FileDescriptor,int&>(&this->fd_);
      in_RDX = sVar3.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      goto LAB_0010a7f1;
    }
    this_00 = Logger::getLogger();
    piVar2 = __errno_location();
    strerror(*piVar2);
    Logger::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    in_RDX._M_pi = extraout_RDX;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 2) = 0;
LAB_0010a7f1:
  fVar4.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  fVar4.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (fdPtr)fVar4.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

fdPtr Liby::FileDescriptor::openFile(const std::string &filepath) {
    int fd;
    if (!filepath.empty()) {
        if ((fd = ::open(filepath.data(), O_RDWR)) >= 0) {
            return std::make_shared<FileDescriptor>(fd);
        } else {
            error("open %s error: %s", filepath.data(), ::strerror(errno));
        }
    }
    return nullptr;
}